

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldGenerator::
ImmutablePrimitiveOneofFieldGenerator
          (ImmutablePrimitiveOneofFieldGenerator *this,FieldDescriptor *descriptor,
          int messageBitIndex,int builderBitIndex,Context *context)

{
  OneofGeneratorInfo *info;
  
  ImmutablePrimitiveFieldGenerator::ImmutablePrimitiveFieldGenerator
            (&this->super_ImmutablePrimitiveFieldGenerator,descriptor,messageBitIndex,
             builderBitIndex,context);
  (this->super_ImmutablePrimitiveFieldGenerator).super_ImmutableFieldGenerator.
  _vptr_ImmutableFieldGenerator = (_func_int **)&PTR__ImmutablePrimitiveOneofFieldGenerator_00315698
  ;
  info = Context::GetOneofGeneratorInfo(context,*(OneofDescriptor **)(descriptor + 0x58));
  SetCommonOneofVariables
            (descriptor,info,&(this->super_ImmutablePrimitiveFieldGenerator).variables_);
  return;
}

Assistant:

ImmutablePrimitiveOneofFieldGenerator::ImmutablePrimitiveOneofFieldGenerator(
    const FieldDescriptor* descriptor, int messageBitIndex, int builderBitIndex,
    Context* context)
    : ImmutablePrimitiveFieldGenerator(descriptor, messageBitIndex,
                                       builderBitIndex, context) {
  const OneofGeneratorInfo* info =
      context->GetOneofGeneratorInfo(descriptor->containing_oneof());
  SetCommonOneofVariables(descriptor, info, &variables_);
}